

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void ipc_on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_buf_t local_10;
  
  if (connection_accepted != '\0') {
    return;
  }
  if (status == 0) {
    if (server == (uv_stream_t *)&tcp_server) {
      iVar1 = uv_tcp_init(tcp_server.loop,&conn.conn);
      if (iVar1 == 0) {
        iVar1 = uv_accept((uv_stream_t *)&tcp_server,(uv_stream_t *)&conn.conn);
        if (iVar1 == 0) {
          uv_close((uv_handle_t *)&conn.conn,close_cb);
          local_10 = uv_buf_init("accepted_connection\n",0x14);
          iVar1 = uv_write2(&conn_notify_req,(uv_stream_t *)&channel,&local_10,1,(uv_stream_t *)0x0,
                            conn_notify_write_cb);
          if (iVar1 == 0) {
            connection_accepted = 1;
            return;
          }
          pcVar3 = "r == 0";
          uVar2 = 0x2ac;
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0x2a5;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x2a2;
      }
    }
    else {
      pcVar3 = "(uv_stream_t*)&tcp_server == server";
      uVar2 = 0x29f;
    }
  }
  else {
    pcVar3 = "status == 0";
    uVar2 = 0x29e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void ipc_on_connection(uv_stream_t* server, int status) {
  int r;
  uv_buf_t buf;

  if (!connection_accepted) {
    /*
     * Accept the connection and close it.  Also let the other
     * side know.
     */
    ASSERT(status == 0);
    ASSERT((uv_stream_t*)&tcp_server == server);

    r = uv_tcp_init(server->loop, &conn.conn);
    ASSERT(r == 0);

    r = uv_accept(server, (uv_stream_t*)&conn.conn);
    ASSERT(r == 0);

    uv_close((uv_handle_t*)&conn.conn, close_cb);

    buf = uv_buf_init("accepted_connection\n", 20);
    r = uv_write2(&conn_notify_req, (uv_stream_t*)&channel, &buf, 1,
      NULL, conn_notify_write_cb);
    ASSERT(r == 0);

    connection_accepted = 1;
  }
}